

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

matches * mergematches(match a,matches *b)

{
  match *pmVar1;
  int iVar2;
  long *in_RDI;
  int in_stack_00000008;
  int j_1;
  match nm;
  ull cmask;
  int j;
  int i;
  matches *res;
  int local_dc;
  int local_d8 [2];
  ulong auStack_d0 [21];
  int local_28;
  ulong local_20;
  int local_18;
  int local_14;
  matches *local_10;
  long *local_8;
  
  local_8 = in_RDI;
  local_10 = emptymatches();
  local_14 = 0;
  do {
    if ((int)local_8[1] <= local_14) {
      free((void *)*local_8);
      free(local_8);
      return local_10;
    }
    local_18 = 0;
    while ((local_18 < 2 &&
           (local_20 = nm.a[(long)local_18 + 1] &
                       *(ulong *)(*local_8 + (long)local_14 * 0xb8 + 0x18 + (long)local_18 * 8),
           (nm.a[(long)local_18 + -1] & local_20) ==
           (*(ulong *)(*local_8 + (long)local_14 * 0xb8 + 8 + (long)local_18 * 8) & local_20)))) {
      local_18 = local_18 + 1;
    }
    if (local_18 == 2) {
      memcpy(local_d8,(void *)(*local_8 + (long)local_14 * 0xb8),0xb8);
      if (local_d8[0] == 0) {
        local_d8[0] = in_stack_00000008;
      }
      for (local_18 = 0; local_18 < 2; local_18 = local_18 + 1) {
        auStack_d0[local_18] = nm.a[(long)local_18 + -1] | auStack_d0[local_18];
        auStack_d0[(long)local_18 + 2] = nm.a[(long)local_18 + 1] | auStack_d0[(long)local_18 + 2];
      }
      if (8 < (int)nm.relocs[7].expr + local_28) {
        __assert_fail("a.nrelocs + nm.nrelocs <= 8",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/polachok[P]envytools/envydis/core.c"
                      ,0x6b,"struct matches *mergematches(struct match, struct matches *)");
      }
      for (local_dc = 0; local_dc < (int)nm.relocs[7].expr; local_dc = local_dc + 1) {
        iVar2 = local_28 + local_dc;
        auStack_d0[(long)iVar2 * 2 + 5] = (ulong)nm.relocs[(long)local_dc + -1].expr;
        auStack_d0[(long)iVar2 * 2 + 6] = (ulong)nm.relocs[local_dc].bf;
      }
      local_28 = (int)nm.relocs[7].expr + local_28;
      if (local_10->mmax <= local_10->mnum) {
        if (local_10->mmax == 0) {
          local_10->mmax = 0x10;
        }
        else {
          local_10->mmax = local_10->mmax << 1;
        }
        pmVar1 = (match *)realloc(local_10->m,(long)local_10->mmax * 0xb8);
        local_10->m = pmVar1;
      }
      iVar2 = local_10->mnum;
      local_10->mnum = iVar2 + 1;
      memcpy(local_10->m + iVar2,local_d8,0xb8);
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

struct matches *mergematches(struct match a, struct matches *b) {
	struct matches *res = emptymatches();
	int i, j;
	for (i = 0; i < b->mnum; i++) {
		for (j = 0; j < MAXOPLEN; j++) {
			ull cmask = a.m[j] & b->m[i].m[j];
			if ((a.a[j] & cmask) != (b->m[i].a[j] & cmask))
				break;
		}
		if (j == MAXOPLEN) {
			struct match nm = b->m[i];
			if (!nm.oplen)
				nm.oplen = a.oplen;
			for (j = 0; j < MAXOPLEN; j++) {
				nm.a[j] |= a.a[j];
				nm.m[j] |= a.m[j];
			}
			int j;
			assert (a.nrelocs + nm.nrelocs <= 8);
			for (j = 0; j < a.nrelocs; j++)
				nm.relocs[nm.nrelocs + j] = a.relocs[j];
			nm.nrelocs += a.nrelocs;
			ADDARRAY(res->m, nm);
		}
	}
	free(b->m);
	free(b);
	return res;
}